

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units_decl.hpp
# Opt level: O2

bool units::detail::compare_round_equals_precise(double val1,double val2)

{
  int iVar1;
  double dVar2;
  double dVar3;
  bool bVar4;
  double dVar5;
  
  dVar3 = val1 - val2;
  bVar4 = true;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    iVar1 = std::fpclassify(dVar3);
    if (iVar1 != 3) {
      dVar3 = (double)((long)val1 + 0x800U & 0xfffffffffffff000);
      dVar5 = (double)((long)val2 + 0x800U & 0xfffffffffffff000);
      if ((dVar3 != dVar5) || (NAN(dVar3) || NAN(dVar5))) {
        dVar2 = (double)((long)(val2 * 1.0000000000005) + 0x800U & 0xfffffffffffff000);
        if ((dVar3 != dVar2) || (NAN(dVar3) || NAN(dVar2))) {
          dVar2 = (double)((long)(val2 * 0.9999999999995) + 0x800U & 0xfffffffffffff000);
          if ((dVar3 != dVar2) || (NAN(dVar3) || NAN(dVar2))) {
            dVar3 = (double)((long)(val1 * 1.0000000000005) + 0x800U & 0xfffffffffffff000);
            if ((dVar5 != dVar3) || (NAN(dVar5) || NAN(dVar3))) {
              bVar4 = (bool)(-(dVar5 == (double)((long)(val1 * 0.9999999999995) + 0x800U &
                                                0xfffffffffffff000)) & 1);
            }
          }
        }
      }
    }
  }
  return bVar4;
}

Assistant:

inline bool compare_round_equals_precise(double val1, double val2)
    {
        static constexpr double half_precise_precision{5e-13};
        auto v1 = val1 - val2;
        if (v1 == 0.0 || std::fpclassify(v1) == FP_SUBNORMAL) {
            return true;
        }
        auto c1 = cround_precise(val1);
        auto c2 = cround_precise(val2);
        // yes these are magic numbers half the value of specified precision of
        // 1e-12 for precise units and yes I am purposely using the floating
        // point equality here
        return (c1 == c2) ||
            (cround_precise(val2 * (1.0 + half_precise_precision)) == c1) ||
            (cround_precise(val2 * (1.0 - half_precise_precision)) == c1) ||
            (cround_precise(val1 * (1.0 + half_precise_precision)) == c2) ||
            (cround_precise(val1 * (1.0 - half_precise_precision)) == c2);
    }